

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void kratos::fix_verilog_ln(Generator *generator,uint32_t offset)

{
  uint32_t *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  __alloc_node_gen_t _Var3;
  undefined1 local_c8 [8];
  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
  stmts;
  StatementGraph graph;
  __alloc_node_gen_t __alloc_node_gen;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (generator->debug == true) {
    puVar1 = &(generator->super_IRNode).verilog_ln;
    *puVar1 = *puVar1 + offset;
    Generator::get_all_var_names_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__alloc_node_gen,generator);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)local_40._M_allocated_capacity) {
      _Var3 = __alloc_node_gen;
      do {
        Generator::get_var((Generator *)&stmts._M_h._M_single_bucket,(string *)generator);
        *(uint32_t *)&stmts._M_h._M_single_bucket[4]._M_nxt =
             *(int *)&stmts._M_h._M_single_bucket[4]._M_nxt + offset;
        if (graph.nodes_._M_h._M_buckets != (__buckets_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)graph.nodes_._M_h._M_buckets);
        }
        _Var3._M_h = _Var3._M_h + 0x20;
      } while (_Var3._M_h != (__hashtable_alloc *)local_40._M_allocated_capacity);
    }
    StatementGraph::StatementGraph((StatementGraph *)&stmts._M_h._M_single_bucket,generator);
    graph.root_ = (Generator *)local_c8;
    local_c8 = (undefined1  [8])0x0;
    stmts._M_h._M_buckets = graph.nodes_._M_h._M_buckets;
    stmts._M_h._M_bucket_count = 0;
    stmts._M_h._M_before_begin = graph.nodes_._M_h._M_before_begin;
    stmts._M_h._M_element_count = graph.nodes_._M_h._M_element_count;
    stmts._M_h._M_rehash_policy._M_max_load_factor =
         graph.nodes_._M_h._M_rehash_policy._M_max_load_factor;
    stmts._M_h._M_rehash_policy._4_4_ = graph.nodes_._M_h._M_rehash_policy._4_4_;
    stmts._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Stmt*const,kratos::StmtNode>,false>>>>
              ((_Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)graph.root_,
               (_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&stmts._M_h._M_single_bucket,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>_>_>
                *)&graph.root_);
    for (puVar2 = (undefined8 *)stmts._M_h._M_bucket_count; puVar2 != (undefined8 *)0x0;
        puVar2 = (undefined8 *)*puVar2) {
      *(int *)(puVar2[1] + 0x20) = *(int *)(puVar2[1] + 0x20) + offset;
    }
    std::
    _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_c8);
    std::
    _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&stmts._M_h._M_single_bucket);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__alloc_node_gen);
  }
  return;
}

Assistant:

void fix_verilog_ln(Generator* generator, uint32_t offset) {
    // need to fix every variable and statement verilog line number by an offset
    if (!generator->debug) return;
    // fix the variable declaration
    generator->verilog_ln += offset;
    auto const& var_names = generator->get_all_var_names();
    for (auto const& var_name : var_names) {
        auto var = generator->get_var(var_name);
        var->verilog_ln += offset;
    }
    // get all the statement graph
    StatementGraph graph(generator);
    auto stmts = graph.nodes();
    for (auto const& iter : stmts) {
        auto* stmt = iter.first;
        stmt->verilog_ln += offset;
    }
}